

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicationConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicationConstraintSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConstraintItemSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ConstraintItemSyntax *args_2)

{
  Token arrow;
  ImplicationConstraintSyntax *this_00;
  ConstraintItemSyntax *args_local_2;
  Token *args_local_1;
  ExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ImplicationConstraintSyntax *)allocate(this,0x30,8);
  arrow.kind = args_1->kind;
  arrow._2_1_ = args_1->field_0x2;
  arrow.numFlags.raw = (args_1->numFlags).raw;
  arrow.rawLen = args_1->rawLen;
  arrow.info = args_1->info;
  slang::syntax::ImplicationConstraintSyntax::ImplicationConstraintSyntax(this_00,args,arrow,args_2)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }